

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::MutableRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  byte bVar1;
  Descriptor *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar6;
  char *description;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
LAB_0025b44c:
    pDVar2 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar7.descriptor,field,"MutableRepeatedMessage");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_0025b48a:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"MutableRepeatedMessage",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    MutableRepeatedMessage();
    goto LAB_0025b44c;
  }
  if ((bVar1 & 0x20) == 0) {
    description = "Field is singular; the method requires a repeated field.";
    goto LAB_0025b48a;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (pDVar2,field,"MutableRepeatedMessage",CPPTYPE_MESSAGE);
  }
  if ((bVar1 & 8) != 0) {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = internal::ExtensionSet::MutableRepeatedMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                        field->number_,index);
    return (Message *)pMVar5;
  }
  if (field->type_ == 0xb) {
    bVar3 = FieldDescriptor::is_map_message_type(field);
    if (bVar3) {
      VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
      this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
      this_01 = internal::MapFieldBase::MutableRepeatedField(this_00);
      goto LAB_0025b423;
    }
  }
  VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
  this_01 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
LAB_0025b423:
  pVVar6 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this_01,index);
  return pVVar6;
}

Assistant:

Message* Reflection::MutableRepeatedMessage(Message* message,
                                            const FieldDescriptor* field,
                                            int index) const {
  USAGE_MUTABLE_CHECK_ALL(MutableRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableRepeatedMessage(field->number(),
                                                             index));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->Mutable<GenericTypeHandler<Message> >(index);
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
          ->Mutable<GenericTypeHandler<Message> >(index);
    }
  }
}